

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_glsl_visitor.cpp
# Opt level: O0

void __thiscall
ir_print_glsl_visitor::emit_assignment_part
          (ir_print_glsl_visitor *this,ir_dereference *lhs,ir_rvalue *rhs,uint write_mask,
          ir_rvalue *dstIndex)

{
  glsl_type *pgVar1;
  bool bVar2;
  int iVar3;
  ir_constant *this_00;
  bool bVar4;
  bool bVar5;
  bool local_79;
  uint local_64;
  bool addSwizzle;
  bool typeMismatch;
  bool hasWriteMask;
  uint i;
  glsl_type *rhsType;
  glsl_type *lhsType;
  char local_46 [2];
  uint j;
  char mask [5];
  char *pcStack_40;
  char comp;
  char *comps;
  ir_constant *dstConst;
  ir_rvalue *dstIndex_local;
  uint write_mask_local;
  ir_rvalue *rhs_local;
  ir_dereference *lhs_local;
  ir_print_glsl_visitor *this_local;
  
  (*(lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[2])();
  if (dstIndex != (ir_rvalue *)0x0) {
    this_00 = ir_instruction::as_constant(&dstIndex->super_ir_instruction);
    if (this_00 == (ir_constant *)0x0) {
      string_buffer::asprintf_append(this->buffer,"[");
      (*(dstIndex->super_ir_instruction)._vptr_ir_instruction[2])(dstIndex,this);
      string_buffer::asprintf_append(this->buffer,"]");
    }
    else {
      pcStack_40 = "xyzw";
      iVar3 = ir_constant::get_int_component(this_00,0);
      j._3_1_ = "xyzw"[iVar3];
      string_buffer::asprintf_append(this->buffer,".%c",(ulong)(uint)(int)j._3_1_);
    }
  }
  lhsType._4_4_ = 0;
  rhsType = (lhs->super_ir_rvalue).type;
  pgVar1 = rhs->type;
  if ((((dstIndex == (ir_rvalue *)0x0) && (rhsType->matrix_columns < 2)) &&
      (1 < rhsType->vector_elements)) &&
     (write_mask != (1 << (rhsType->vector_elements & 0x1f)) - 1U)) {
    for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
      if ((write_mask & 1 << ((byte)local_64 & 0x1f)) != 0) {
        local_46[lhsType._4_4_] = "xyzw"[local_64];
        lhsType._4_4_ = lhsType._4_4_ + 1;
      }
    }
    rhsType = glsl_type::get_instance(*(uint *)&rhsType->field_0x4 & 0xff,lhsType._4_4_,1,0,false);
  }
  local_46[lhsType._4_4_] = '\0';
  if (local_46[0] != '\0') {
    string_buffer::asprintf_append(this->buffer,".%s",local_46);
  }
  string_buffer::asprintf_append(this->buffer," = ");
  bVar4 = dstIndex == (ir_rvalue *)0x0;
  bVar5 = rhsType != pgVar1;
  local_79 = bVar4 && bVar5;
  bVar2 = false;
  if (local_46[0] != '\0') {
    bVar2 = local_79;
  }
  if (bVar4 && bVar5) {
    if (!bVar2) {
      print_type(this->buffer,rhsType,true);
    }
    string_buffer::asprintf_append(this->buffer,"(");
  }
  (*(rhs->super_ir_instruction)._vptr_ir_instruction[2])(rhs,this);
  if ((bVar4 && bVar5) && (string_buffer::asprintf_append(this->buffer,")"), bVar2)) {
    string_buffer::asprintf_append(this->buffer,".%s",local_46);
  }
  return;
}

Assistant:

void ir_print_glsl_visitor::emit_assignment_part (ir_dereference* lhs, ir_rvalue* rhs, unsigned write_mask, ir_rvalue* dstIndex)
{
	lhs->accept(this);
	
	if (dstIndex)
	{
		// if dst index is a constant, then emit a swizzle
		ir_constant* dstConst = dstIndex->as_constant();
		if (dstConst)
		{
			const char* comps = "xyzw";
			char comp = comps[dstConst->get_int_component(0)];
			buffer.asprintf_append (".%c", comp);
		}
		else
		{
			buffer.asprintf_append ("[");
			dstIndex->accept(this);
			buffer.asprintf_append ("]");
		}
	}
	
	char mask[5];
	unsigned j = 0;
	const glsl_type* lhsType = lhs->type;
	const glsl_type* rhsType = rhs->type;
	if (!dstIndex && lhsType->matrix_columns <= 1 && lhsType->vector_elements > 1 && write_mask != (1<<lhsType->vector_elements)-1)
	{
		for (unsigned i = 0; i < 4; i++) {
			if ((write_mask & (1 << i)) != 0) {
				mask[j] = "xyzw"[i];
				j++;
			}
		}
		lhsType = glsl_type::get_instance(lhsType->base_type, j, 1);
	}
	mask[j] = '\0';
	bool hasWriteMask = false;
	if (mask[0])
	{
		buffer.asprintf_append (".%s", mask);
		hasWriteMask = true;
	}
	
	buffer.asprintf_append (" = ");
	
	bool typeMismatch = !dstIndex && (lhsType != rhsType);
	const bool addSwizzle = hasWriteMask && typeMismatch;
	if (typeMismatch)
	{
		if (!addSwizzle)
			print_type(buffer, lhsType, true);
		buffer.asprintf_append ("(");
	}
	
	rhs->accept(this);
	
	if (typeMismatch)
	{
		buffer.asprintf_append (")");
		if (addSwizzle)
			buffer.asprintf_append (".%s", mask);
	}
}